

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederate.cpp
# Opt level: O2

ValueFederate * __thiscall helics::ValueFederate::operator=(ValueFederate *this,ValueFederate *fed)

{
  std::
  __uniq_ptr_impl<helics::ValueFederateManager,_std::default_delete<helics::ValueFederateManager>_>
  ::operator=((__uniq_ptr_impl<helics::ValueFederateManager,_std::default_delete<helics::ValueFederateManager>_>
               *)&this->vfManager,
              (__uniq_ptr_impl<helics::ValueFederateManager,_std::default_delete<helics::ValueFederateManager>_>
               *)&fed->vfManager);
  if (*(int *)(&this->field_0x10 + (long)this->_vptr_ValueFederate[-3]) !=
      *(int *)(&fed->field_0x10 + (long)fed->_vptr_ValueFederate[-3])) {
    Federate::operator=((Federate *)
                        ((long)&this->_vptr_ValueFederate + (long)this->_vptr_ValueFederate[-3]),
                        (Federate *)
                        ((long)&fed->_vptr_ValueFederate + (long)fed->_vptr_ValueFederate[-3]));
  }
  return this;
}

Assistant:

ValueFederate& ValueFederate::operator=(ValueFederate&& fed) noexcept
{
    vfManager = std::move(fed.vfManager);
    if (getID() != fed.getID()) {  // the id won't be moved, as it is copied so use it as a test if
                                   // it has moved already
        Federate::operator=(std::move(fed));
    }
    return *this;
}